

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O2

void secp256k1_modinv32_mul_30
               (secp256k1_modinv32_signed30 *r,secp256k1_modinv32_signed30 *a,int alen,
               int32_t factor)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    if (lVar2 < alen) {
      lVar1 = lVar1 + (long)a->v[lVar2] * (long)factor;
    }
    r->v[lVar2] = (uint)lVar1 & 0x3fffffff;
    lVar1 = lVar1 >> 0x1e;
  }
  if (8 < alen) {
    lVar1 = lVar1 + (long)a->v[8] * (long)factor;
  }
  if ((int)lVar1 == lVar1) {
    r->v[8] = (int)lVar1;
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
          ,0x24,"test condition failed: c == (int32_t)c",8,lVar1);
  abort();
}

Assistant:

static void secp256k1_modinv32_mul_30(secp256k1_modinv32_signed30 *r, const secp256k1_modinv32_signed30 *a, int alen, int32_t factor) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    int64_t c = 0;
    int i;
    for (i = 0; i < 8; ++i) {
        if (i < alen) c += (int64_t)a->v[i] * factor;
        r->v[i] = (int32_t)c & M30; c >>= 30;
    }
    if (8 < alen) c += (int64_t)a->v[8] * factor;
    VERIFY_CHECK(c == (int32_t)c);
    r->v[8] = (int32_t)c;
}